

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.hpp
# Opt level: O0

pair<const_unsigned_long_&,_const_unsigned_long_&> Disa::order_edge_vertex(Edge *edge)

{
  ostream *poVar1;
  source_location *in_RCX;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Edge *local_20;
  Edge *edge_local;
  
  local_20 = edge;
  if (edge == (Edge *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001b16b0;
    console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,in_RCX);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    poVar1 = std::operator<<(poVar1,"Parsed edge point is null.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  if (edge->first < edge->second) {
    std::pair<const_unsigned_long_&,_const_unsigned_long_&>::
    pair<const_unsigned_long_&,_const_unsigned_long_&,_true>
              ((pair<const_unsigned_long_&,_const_unsigned_long_&> *)&edge_local,&edge->first,
               &edge->second);
  }
  else {
    std::pair<const_unsigned_long_&,_const_unsigned_long_&>::
    pair<const_unsigned_long_&,_const_unsigned_long_&,_true>
              ((pair<const_unsigned_long_&,_const_unsigned_long_&> *)&edge_local,&edge->second,
               &edge->first);
  }
  return _edge_local;
}

Assistant:

constexpr std::pair<const std::size_t&, const std::size_t&> order_edge_vertex(const Edge* edge) {
  ASSERT_DEBUG(edge != nullptr, "Parsed edge point is null.");
  return edge->first < edge->second ? std::pair<const std::size_t&, const std::size_t&>({edge->first, edge->second})
                                    : std::pair<const std::size_t&, const std::size_t&>({edge->second, edge->first});
}